

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

int __thiscall CWire::SplitWire(CWire *this,CPoint *pPoint,CWire **ppWireS,CWire **ppWireE)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  CNet *pCVar8;
  CLayer *this_00;
  CWire *this_01;
  CWire *this_02;
  bool bVar9;
  CWire *pNewWireE;
  CWire *pNewWireS;
  CNet *pNet;
  CWire **ppWireE_local;
  CWire **ppWireS_local;
  CPoint *pPoint_local;
  CWire *this_local;
  
  pCVar8 = GetParent(this);
  if (pCVar8 == (CNet *)0x0) {
    __assert_fail("GetParent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x4c3,"int CWire::SplitWire(CPoint *, CWire **, CWire **)");
  }
  iVar1 = IsLayerAssigned(this);
  if (iVar1 == 0) {
    bVar9 = true;
  }
  else {
    iVar1 = CPoint::Z(pPoint);
    this_00 = GetLayer(this);
    iVar2 = CLayer::Z(this_00);
    bVar9 = iVar1 == iVar2;
  }
  if (!bVar9) {
    __assert_fail("IsLayerAssigned()? pPoint->Z()==GetLayer()->Z():TRUE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x4c5,"int CWire::SplitWire(CPoint *, CWire **, CWire **)");
  }
  iVar1 = IsOn3D(this,pPoint);
  if (((iVar1 == 0) || (iVar1 = CPoint::IsSame3D(this->m_pPointS,pPoint), iVar1 != 0)) ||
     (iVar1 = CPoint::IsSame3D(this->m_pPointE,pPoint), iVar1 != 0)) {
    return 0;
  }
  pCVar8 = GetParent(this);
  if (pCVar8 == (CNet *)0x0) {
    __assert_fail("pNet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x4ca,"int CWire::SplitWire(CPoint *, CWire **, CWire **)");
  }
  this_01 = New();
  if (this_01 != (CWire *)0x0) {
    uVar3 = CPoint::X(this->m_pPointS);
    uVar4 = CPoint::Y(this->m_pPointS);
    uVar5 = CPoint::X(pPoint);
    uVar6 = CPoint::Y(pPoint);
    uVar7 = CPoint::Z(pPoint);
    (*(this_01->super_CObject)._vptr_CObject[3])
              (this_01,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,this);
    SetParent(this_01,(CNet *)0x0);
    this_02 = New();
    if (this_02 != (CWire *)0x0) {
      uVar3 = CPoint::X(pPoint);
      uVar4 = CPoint::Y(pPoint);
      uVar5 = CPoint::X(this->m_pPointE);
      uVar6 = CPoint::Y(this->m_pPointE);
      uVar7 = CPoint::Z(this->m_pPointE);
      (*(this_02->super_CObject)._vptr_CObject[3])
                (this_02,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,this);
      SetParent(this_02,(CNet *)0x0);
      CNet::DelWire(pCVar8,this,0);
      CNet::AddWire(pCVar8,this_01);
      CNet::AddWire(pCVar8,this_02);
      if (ppWireS != (CWire **)0x0) {
        *ppWireS = this_01;
      }
      if (ppWireE != (CWire **)0x0) {
        *ppWireE = this_02;
      }
      return 1;
    }
    __assert_fail("pNewWireE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x4d2,"int CWire::SplitWire(CPoint *, CWire **, CWire **)");
  }
  __assert_fail("pNewWireS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x4cd,"int CWire::SplitWire(CPoint *, CWire **, CWire **)");
}

Assistant:

int CWire::SplitWire(CPoint *pPoint, CWire** ppWireS, CWire** ppWireE)
{	
	// make sure it is checked in into the net [6/30/2006 thyeros]
	//assert(IsRouted());

	// replace by parent checking [3/31/2007 thyeros]
	assert(GetParent());

	assert(IsLayerAssigned()? pPoint->Z()==GetLayer()->Z():TRUE);

	if(!IsOn3D(pPoint)||m_pPointS->IsSame3D(pPoint)||m_pPointE->IsSame3D(pPoint))	return	FALSE;

	CNet*	pNet		=	GetParent();
	assert(pNet);

	CWire*	pNewWireS	=	CWire::New();//new	CWire;
	assert(pNewWireS);
	pNewWireS->Initialize(m_pPointS->X(),m_pPointS->Y(),pPoint->X(),pPoint->Y(),pPoint->Z(),this);
	pNewWireS->SetParent(NULL);

	CWire*	pNewWireE	=	CWire::New();//new	CWire;
	assert(pNewWireE);
	pNewWireE->Initialize(pPoint->X(),pPoint->Y(),m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z(),this);
	pNewWireE->SetParent(NULL);

	// check out the current one first [7/6/2006 thyeros]
	// DO NOT delete here [7/8/2006 thyeros]
	pNet->DelWire(this);

	// check in the new two ones [7/6/2006 thyeros]
	pNet->AddWire(pNewWireS);
	pNet->AddWire(pNewWireE);

	if(ppWireS)	*ppWireS	=	pNewWireS;
	if(ppWireE)	*ppWireE	=	pNewWireE;

	return	TRUE;
}